

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void absFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  Mem *pMem;
  ulong uVar1;
  double dVar2;
  double val;
  
  pMem = *argv;
  if (pMem->type == '\x05') {
    sqlite3VdbeMemSetNull(&context->s);
    return;
  }
  if (pMem->type == '\x01') {
    uVar1 = sqlite3VdbeIntValue(pMem);
    if ((long)uVar1 < 0) {
      if ((uVar1 & 0x7fffffffffffffff) == 0) {
        context->isError = 1;
        sqlite3VdbeMemSetStr
                  (&context->s,"integer overflow",-1,'\x01',
                   (_func_void_void_ptr *)0xffffffffffffffff);
        return;
      }
      uVar1 = -uVar1;
    }
    sqlite3VdbeMemRelease(&context->s);
    (context->s).u.i = uVar1;
    (context->s).flags = 4;
    (context->s).type = '\x01';
    return;
  }
  dVar2 = sqlite3VdbeRealValue(pMem);
  val = -dVar2;
  if (-dVar2 <= dVar2) {
    val = dVar2;
  }
  sqlite3VdbeMemSetDouble(&context->s,val);
  return;
}

Assistant:

static void absFunc(sqlite3_context *context, int argc, sqlite3_value **argv){
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  switch( sqlite3_value_type(argv[0]) ){
    case SQLITE_INTEGER: {
      i64 iVal = sqlite3_value_int64(argv[0]);
      if( iVal<0 ){
        if( (iVal<<1)==0 ){
          /* IMP: R-35460-15084 If X is the integer -9223372036854775807 then
          ** abs(X) throws an integer overflow error since there is no
          ** equivalent positive 64-bit two complement value. */
          sqlite3_result_error(context, "integer overflow", -1);
          return;
        }
        iVal = -iVal;
      } 
      sqlite3_result_int64(context, iVal);
      break;
    }
    case SQLITE_NULL: {
      /* IMP: R-37434-19929 Abs(X) returns NULL if X is NULL. */
      sqlite3_result_null(context);
      break;
    }
    default: {
      /* Because sqlite3_value_double() returns 0.0 if the argument is not
      ** something that can be converted into a number, we have:
      ** IMP: R-57326-31541 Abs(X) return 0.0 if X is a string or blob that
      ** cannot be converted to a numeric value. 
      */
      double rVal = sqlite3_value_double(argv[0]);
      if( rVal<0 ) rVal = -rVal;
      sqlite3_result_double(context, rVal);
      break;
    }
  }
}